

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.hpp
# Opt level: O3

shared_ptr<int> __thiscall
CJSON::GetValue<std::shared_ptr<int>>(CJSON *this,string *Name,size_t *Size)

{
  int iVar1;
  iterator iVar2;
  void *pvVar3;
  ulong *in_RCX;
  ulong uVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  shared_ptr<int> sVar6;
  vector<int,_std::allocator<int>_> local_40;
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)Name,(key_type *)Size);
  _Var5._M_pi = extraout_RDX;
  if (iVar2._M_node != (_Base_ptr)&Name->_M_string_length) {
    iVar1 = std::__cxx11::string::compare((char *)(iVar2._M_node + 2));
    _Var5._M_pi = extraout_RDX_00;
    if (iVar1 != 0) {
      ParseValue<std::vector<int,_std::allocator<int>_>,_nullptr>
                (&local_40,(CJSON *)Name,(string *)(iVar2._M_node + 2));
      uVar4 = (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2;
      *in_RCX = uVar4;
      pvVar3 = operator_new__(-(ulong)(uVar4 >> 0x3e != 0) |
                              (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                              (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
      *(void **)&(this->m_Values)._M_t._M_impl = pvVar3;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<int*,std::default_delete<int[]>,std::allocator<void>,void>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &(this->m_Values)._M_t._M_impl.super__Rb_tree_header,pvVar3);
      memcpy(*(void **)&(this->m_Values)._M_t._M_impl,
             local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,*in_RCX << 2);
      _Var5._M_pi = extraout_RDX_01;
      if (local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
        _Var5._M_pi = extraout_RDX_02;
      }
      goto LAB_0012c9ca;
    }
  }
  *in_RCX = 0;
  *(undefined8 *)&(this->m_Values)._M_t._M_impl = 0;
  *(undefined8 *)&(this->m_Values)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
LAB_0012c9ca:
  sVar6.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var5._M_pi;
  sVar6.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<int>)sVar6.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

T GetValue(const std::string &Name, size_t &Size)
        {
            std::map<std::string, std::string>::iterator IT = m_Values.find(Name);
            if(IT == m_Values.end())
            {
                Size = 0;
                return nullptr;
            }

            if(IT->second == "null")
            {
                Size = 0;
                return AddNullObj<T>();
            }

            return ParseArray<T>(IT->second, Size);
        }